

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialize.c
# Opt level: O0

fdtd * initializeFdtd1D(uint setupID,float_type domain_size,float_type Sc,
                       float_type smallest_wavelength)

{
  fdtd_source src_00;
  int in_ESI;
  fdtd *in_RDI;
  fdtd_source src;
  two_medium_data tmd;
  fdtd1D fdtd;
  border_condition bc [2];
  setup1D sID;
  void *in_stack_fffffffffffffed8;
  init_medium_fun in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  source_type in_stack_fffffffffffffeec;
  fdtd *pfVar1;
  float_type in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 local_b8 [8];
  double local_b0;
  undefined8 local_2c;
  
  if (in_ESI == 0) {
    local_2c = 0x200000001;
    pfVar1 = in_RDI;
    init_fdtd_1D((float_type)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(float_type)in_RDI,
                 &in_RDI->type);
    init_fdtd_1D_medium((fdtd1D *)in_RDI,
                        (init_medium_fun)
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                        in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    gaussian_source((fdtd_source *)&stack0xffffffffffffff00,local_b0 * 25.0,local_b0 * 3.0,0.01);
    src_00.field_1.field_0.gaussian_pulse_delay = (float_type)in_stack_ffffffffffffff08;
    src_00._0_8_ = in_stack_ffffffffffffff00;
    src_00.field_1.field_0.gaussian_pulse_peak_time = (float_type)in_stack_ffffffffffffff10;
    src_00.field_1.field_0.gaussian_peak_val = (float_type)in_stack_ffffffffffffff18;
    add_source_fdtd_1D(in_stack_fffffffffffffeec,(fdtd1D *)in_stack_ffffffffffffff18,src_00,
                       (float_type)in_stack_ffffffffffffff10);
    in_RDI->type = fdtd_one_dim;
    memcpy(&in_RDI->field_1,local_b8,0x88);
    return pfVar1;
  }
  fprintf(_stderr,"The specified 1D setup ID is does not exist\n");
  exit(1);
}

Assistant:

static struct fdtd initializeFdtd1D(unsigned setupID, float_type domain_size,
                                    float_type Sc,
                                    float_type smallest_wavelength) {
  enum setup1D sID = (enum setup1D)setupID;
  switch (sID) {
  case half_air_half_water_1D: {
    enum border_condition bc[2] = {border_perfect_electric_conductor,
                                   border_perfect_magnetic_conductor};
    struct fdtd1D fdtd = init_fdtd_1D(domain_size, Sc, smallest_wavelength, bc);
    struct two_medium_data tmd = {.permittivity1 = float_cst(1.00058986),
                                  .permittivity2 = float_cst(78.4),
                                  .permeability1 = float_cst(1.00000037),
                                  .permeability2 = float_cst(0.999992),
                                  .switch_location =
                                      domain_size / float_cst(2.)};
    init_fdtd_1D_medium(&fdtd, init_permeability_two_parts_1D,
                        init_permittivity_two_parts_1D, &tmd);
    struct fdtd_source src = gaussian_source(
        float_cst(25.) * fdtd.dt, float_cst(3.) * fdtd.dt, float_cst(1.e-2));
    add_source_fdtd_1D(source_magnetic, &fdtd, src, float_cst(0.));
    struct fdtd retval = {.oneDim = fdtd, .type = fdtd_one_dim};
    return retval;
  }
  default:
    fprintf(stderr, "The specified 1D setup ID is does not exist\n");
    exit(EXIT_FAILURE);
  }
}